

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

bool __thiscall Character::DelItem(Character *this,short item,int amount)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  if (amount < 1) {
    return false;
  }
  p_Var3 = (_List_node_base *)&this->inventory;
  do {
    p_Var3 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var3->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->inventory) {
      return false;
    }
  } while (*(short *)&p_Var3[1]._M_next != item);
  iVar2 = *(int *)((long)&p_Var3[1]._M_next + 4);
  if ((iVar2 < 0) || (iVar2 - amount == 0 || iVar2 < amount)) {
    psVar1 = &(this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
  }
  else {
    *(int *)((long)&p_Var3[1]._M_next + 4) = iVar2 - amount;
  }
  CalculateStats(this,true);
  return true;
}

Assistant:

bool Character::DelItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount < 0 || it->amount - amount <= 0)
			{
				this->inventory.erase(it);
			}
			else
			{
				it->amount -= amount;
			}

			this->CalculateStats();

			return true;
		}
	}

	return false;
}